

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O3

void __thiscall
gvr::ColoredPointCloud::ColoredPointCloud
          (ColoredPointCloud *this,ColoredMesh *p,vector<bool,_std::allocator<bool>_> *vused)

{
  int iVar1;
  uchar *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  PointCloud::PointCloud(&this->super_PointCloud,(PointCloud *)p,vused);
  (this->super_PointCloud).super_Model._vptr_Model = (_func_int **)&PTR__ColoredPointCloud_00177148;
  iVar5 = (this->super_PointCloud).n;
  iVar1 = -1;
  if (-1 < iVar5) {
    iVar1 = iVar5 * 3;
  }
  puVar2 = (uchar *)operator_new__((long)iVar1);
  this->rgb = puVar2;
  iVar5 = (p->super_Mesh).super_PointCloud.n;
  if (0 < iVar5) {
    lVar3 = 0;
    uVar4 = 0;
    iVar1 = 0;
    do {
      if ((*(ulong *)(*(long *)vused + (uVar4 >> 6 & 0x3ffffff) * 8) >> (uVar4 & 0x3f) & 1) != 0) {
        this->rgb[iVar1] = p->rgb[lVar3];
        this->rgb[(long)iVar1 + 1] = p->rgb[lVar3 + 1];
        this->rgb[(long)iVar1 + 2] = p->rgb[lVar3 + 2];
        iVar5 = (p->super_Mesh).super_PointCloud.n;
        iVar1 = iVar1 + 3;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 3;
    } while ((long)uVar4 < (long)iVar5);
  }
  return;
}

Assistant:

ColoredPointCloud::ColoredPointCloud(const ColoredMesh &p,
                                     const std::vector<bool> &vused) : PointCloud(p, vused)
{
  rgb=new unsigned char [3*getVertexCount()];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      rgb[k++]=p.getColorComp(i, 0);
      rgb[k++]=p.getColorComp(i, 1);
      rgb[k++]=p.getColorComp(i, 2);
    }
  }
}